

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lr0.c
# Opt level: O2

void set_derives(void)

{
  char *pcVar1;
  Yshort *pYVar2;
  char *pcVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  
  derives = (Yshort **)allocate(nsyms << 3);
  pcVar3 = allocate((nrules + nvars) * 4);
  iVar7 = 0;
  for (lVar4 = (long)start_symbol; lVar4 < nsyms; lVar4 = lVar4 + 1) {
    derives[lVar4] = (Yshort *)(pcVar3 + (long)iVar7 * 4);
    pYVar2 = rlhs;
    iVar6 = nrules;
    for (lVar5 = 0; lVar5 < iVar6; lVar5 = lVar5 + 1) {
      if (pYVar2[lVar5] == (int)lVar4) {
        *(int *)(pcVar3 + (long)iVar7 * 4) = (int)lVar5;
        iVar7 = iVar7 + 1;
        iVar6 = nrules;
      }
    }
    pcVar1 = pcVar3 + (long)iVar7 * 4;
    pcVar1[0] = -1;
    pcVar1[1] = -1;
    pcVar1[2] = -1;
    pcVar1[3] = -1;
    iVar7 = iVar7 + 1;
  }
  return;
}

Assistant:

void set_derives()
{
    register int i, k;
    register int lhs;
    register Yshort *rules;

    derives = NEW2(nsyms, Yshort *);
    rules = NEW2(nvars + nrules, Yshort);

    k = 0;
    for (lhs = start_symbol; lhs < nsyms; lhs++)
    {
	derives[lhs] = rules + k;
	for (i = 0; i < nrules; i++)
	{
	    if (rlhs[i] == lhs)
	    {
		rules[k] = i;
		k++;
	    }
	}
	rules[k] = -1;
	k++;
    }

#ifdef	DEBUG
    print_derives();
#endif
}